

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O2

bool __thiscall
sisl::body_centered_cubic<float>::is_lattice_site
          (body_centered_cubic<float> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  uint *puVar2;
  byte *pbVar3;
  uint uVar4;
  int _x;
  ulong uVar5;
  
  uVar1 = vl->gp_offset;
  uVar5 = (ulong)uVar1;
  if (uVar5 < 0x29) {
    vl->gp_offset = (uint)(uVar5 + 8);
    uVar4 = *(uint *)((long)vl->reg_save_area + uVar5);
    if (uVar1 < 0x21) {
      pbVar3 = (byte *)(uVar5 + 8 + (long)vl->reg_save_area);
      vl->gp_offset = uVar1 + 0x10;
      goto LAB_00119a12;
    }
  }
  else {
    puVar2 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = puVar2 + 2;
    uVar4 = *puVar2;
  }
  pbVar3 = (byte *)vl->overflow_arg_area;
  vl->overflow_arg_area = pbVar3 + 8;
LAB_00119a12:
  if ((*pbVar3 & 1) == 0) {
    if (((d0 & 0x80000001U) == 1) || ((uVar4 & 0x80000001) == 1)) {
      return false;
    }
  }
  else if ((d0 & uVar4 & 1) == 0) {
    return false;
  }
  return true;
}

Assistant:

virtual bool is_lattice_site(int d0, va_list vl) const {
            int _x = d0, _y = 0, _z = 0;

            _y = va_arg(vl, int);
            _z = va_arg(vl, int);

            if((_z % 2)) {
                if((_y % 2) == 0 || (_x % 2) == 0) {
                    return false;
                }
            } else if((_y % 2) == 1 || (_x % 2) == 1) {
                return false;
            }
            return true;
        }